

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O3

bool __thiscall Network::Client::RingBufferStorage::Impl::release(Impl *this,uint16 packetID)

{
  int iVar1;
  uint uVar2;
  PacketBookmark *pPVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  bVar11 = this->packetsCount;
  if ((ulong)bVar11 == 0) {
    return false;
  }
  lVar9 = 8;
  uVar6 = 0;
  while (*(uint16 *)(this->packets + lVar9 + -8) != packetID) {
    uVar6 = uVar6 + 1;
    lVar9 = lVar9 + 0xc;
    if (bVar11 == uVar6) {
      return false;
    }
  }
  bVar4 = (byte)uVar6 < bVar11;
  if (bVar11 <= (byte)uVar6) {
    return false;
  }
  pPVar3 = this->packets;
  iVar1 = *(int *)(pPVar3 + lVar9 + -4);
  uVar7 = *(uint *)(pPVar3 + lVar9);
  uVar13 = iVar1 + uVar7;
  uVar12 = this->sm1;
  uVar10 = uVar13 & uVar12;
  *(undefined2 *)(pPVar3 + lVar9 + -8) = 0;
  *(undefined4 *)(pPVar3 + lVar9 + -4) = 0;
  *(undefined4 *)(pPVar3 + lVar9) = 0;
  if (uVar7 == this->r) {
    this->r = uVar10;
  }
  else {
    uVar2 = this->w;
    if (uVar10 != uVar2) {
      uVar8 = ~uVar12;
      iVar5 = uVar12 + 1;
      uVar14 = 0;
      if (uVar7 <= uVar2) {
        iVar5 = 0;
      }
      if (uVar7 <= uVar10) {
        uVar8 = 0;
      }
      uVar8 = (uVar8 - uVar10) + iVar5 + uVar2;
      if (uVar8 != 0) {
        do {
          this->buffer[uVar7 + uVar14 & this->sm1] = this->buffer[uVar13 + uVar14 & this->sm1];
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar8);
        uVar12 = this->sm1;
        bVar11 = this->packetsCount;
      }
      this->w = (iVar5 + uVar2) - iVar1 & uVar12;
      if (bVar11 == 0) {
        return bVar4;
      }
      pPVar3 = this->packets;
      do {
        lVar9 = 0;
        while (*(uint *)(pPVar3 + lVar9 + 8) != uVar10) {
          lVar9 = lVar9 + 0xc;
          if ((ulong)((uint)bVar11 * 4) * 3 == lVar9) {
            return bVar4;
          }
        }
        uVar10 = uVar10 + *(int *)(pPVar3 + lVar9 + 4) & uVar12;
        *(uint *)(pPVar3 + lVar9 + 8) = uVar7;
        uVar7 = *(int *)(pPVar3 + lVar9 + 4) + uVar7 & uVar12;
      } while (bVar11 != 0);
      return bVar4;
    }
    this->w = uVar7;
  }
  return true;
}

Assistant:

bool release(const uint16 packetID)
        {
            uint8 i = findID(packetID);
            if (i == packetsCount) return false;

            PacketBookmark & packet = packets[i];

            // Here, we have 2 cases. Either the packet is on the read position of the ring buffer
            // and in that case, we just need to advance the read position.
            // Either it's in the middle of the ring buffer and we need to move all the data around to remove it
            // Let's deal with the former case first
            uint32 pos = packet.pos, size = packet.size, end = (packet.pos + packet.size) & sm1;
            packet.set(0, 0, 0);
            if (pos == r)
            {
                r = (r + size) & sm1;
                return true;
            }

            // Another optimization step is when the write position is at the end of this packet
            // We can just revert the storage of the packet directly
            if (end == w)
            {
                w = pos;
                return true;
            }

            // Ok, now we have to move the data around here
            // First let's move memory to remove that packet.
            // We'll fix the packet's position later on
            // We are in this case here:
            //  bbbbccw  r p   eaaaaaaaaa      with p/e (pos/end) and a / b / c the next packet
            //        |  | |   |
            // [-------------------------]
            // After move, it should look like:
            //  ccw       r aaaaaaaaabbbb      with p/e (pos/end) and a / b / c the next packet
            //    |       | |   |
            // [-------------------------]
            // We see they are 3 sections: a is the data between e and the buffer end
            // b is the data whose size is equal to buffer end - p - sizeof(a) (the part that was moved from
            // the beginning of the buffer to the end of the buffer)
            // and c is the part that was move from the end of the packet to the beginning of the buffer
            // We have to perform move a to p, move b to buffer.end - a.size and move c to buffer begin

            // It's hard to think without unwrapping the buffer, so let's imagine we are doing so (we'll rewrap after discussion)
            // Let's set w' = w+sm1+1, e' = e + (sm1 - 1)
            // It'll lead to this diagram:
            //  bbbbccw  r p   eaaaaaaaaa BBBBCCW       with p/e (pos/end) and a / b / c the next packet
            //        |  | |   |                |
            // [-------------------------:-------------------------]
            // Or
            //     eaacccccw  r        p     EAACCCCCW
            //     |       |  |        |     |       |
            // [-------------------------:-------------------------]
            // Or
            //      r  p    eaaaaa w
            //      |  |    |    | |
            // [-------------------------:-------------------------]
            // In that case, we are doing a single memory move operation here, but we simply wrap the position
            uint32 s = sm1 + 1, W = w < pos ? w + s : w, E = end < pos ? end + s : end;

            for (uint32 u = 0; u < W - E; u++)
                buffer[(u + pos) & sm1] = buffer[(u + pos + size) & sm1];

            // Adjust the new write position
            w = (W - size) & sm1;

            // We can split the packets in 2 cases: before or after the packet to remove.
            // We'll iterate each packet and decide if we need to move it (it's after the packet to remove)
            // This isn't the most efficient algorithm, but since the number of packets to store is small
            // there's no point in optimizing it further

            bool continueSearching = true;
            while (continueSearching)
            {
                continueSearching = false;
                for (uint8 j = 0; j < packetsCount; j++)
                {
                    PacketBookmark & iter = packets[j];
                    if (iter.pos == end)
                    {
                        end = (iter.pos + iter.size) & sm1;
                        iter.pos = pos;
                        pos = (iter.pos + iter.size) & sm1;
                        continueSearching = true;
                        break;
                    }
                }
            }
            return true;
        }